

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

void __thiscall
cimg_library::CImg<float>::CImg<unsigned_int>(CImg<float> *this,CImg<unsigned_int> *img)

{
  undefined1 auVar1 [16];
  ulongT uVar2;
  ulong uVar3;
  float *pfVar4;
  ulongT uVar5;
  float *_maxptrd;
  float *ptrd;
  uint *ptrs;
  size_t siz;
  CImg<unsigned_int> *img_local;
  CImg<float> *this_local;
  
  this->_is_shared = false;
  uVar2 = cimg_library::CImg<unsigned_int>::size(img);
  if ((img->_data == (uint *)0x0) || (uVar2 == 0)) {
    this->_spectrum = 0;
    this->_depth = 0;
    this->_height = 0;
    this->_width = 0;
    this->_data = (float *)0x0;
  }
  else {
    this->_width = img->_width;
    this->_height = img->_height;
    this->_depth = img->_depth;
    this->_spectrum = img->_spectrum;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pfVar4 = (float *)operator_new__(uVar3);
    this->_data = pfVar4;
    ptrd = (float *)img->_data;
    _maxptrd = this->_data;
    pfVar4 = this->_data;
    uVar5 = size(this);
    for (; _maxptrd < pfVar4 + uVar5; _maxptrd = _maxptrd + 1) {
      *_maxptrd = (float)(uint)*ptrd;
      ptrd = ptrd + 1;
    }
  }
  return;
}

Assistant:

CImg(const CImg<t>& img):_is_shared(false) {
      const size_t siz = (size_t)img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(sizeof(T)*img._width*img._height*img._depth*img._spectrum),
                                      img._width,img._height,img._depth,img._spectrum);
        }
        const t *ptrs = img._data; cimg_for(*this,ptrd,T) *ptrd = (T)*(ptrs++);
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }